

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O0

void __thiscall validation_layer::eventsChecker::eventsChecker(eventsChecker *this)

{
  bool bVar1;
  ZEeventsChecker *this_00;
  ZESeventsChecker *this_01;
  ZETeventsChecker *this_02;
  value_type local_40;
  ZETeventsChecker *local_38;
  ZETeventsChecker *zetChecker;
  ZESeventsChecker *zesChecker;
  ZEeventsChecker *local_18;
  ZEeventsChecker *zeChecker;
  eventsChecker *this_local;
  
  this->enableEvents = false;
  zeChecker = (ZEeventsChecker *)this;
  bVar1 = getenv_tobool("ZEL_ENABLE_EVENTS_CHECKER");
  this->enableEvents = bVar1;
  if ((this->enableEvents & 1U) != 0) {
    this_00 = (ZEeventsChecker *)operator_new(0x80);
    ZEeventsChecker::ZEeventsChecker(this_00);
    local_18 = this_00;
    this_01 = (ZESeventsChecker *)operator_new(8);
    ZESeventsChecker::ZESeventsChecker(this_01);
    zetChecker = (ZETeventsChecker *)this_01;
    this_02 = (ZETeventsChecker *)operator_new(8);
    ZETeventsChecker::ZETeventsChecker(this_02);
    events_checker = local_18;
    DAT_00322f18 = zetChecker;
    local_40 = (value_type)&events_checker;
    DAT_00322f20 = this_02;
    local_38 = this_02;
    std::
    vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
    ::push_back((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                 *)(context + 0xd30),&local_40);
  }
  return;
}

Assistant:

eventsChecker::eventsChecker() {

    enableEvents = getenv_tobool("ZEL_ENABLE_EVENTS_CHECKER");
    if (enableEvents) {
        eventsChecker::ZEeventsChecker *zeChecker = new eventsChecker::ZEeventsChecker;
        eventsChecker::ZESeventsChecker *zesChecker = new eventsChecker::ZESeventsChecker;
        eventsChecker::ZETeventsChecker *zetChecker = new eventsChecker::ZETeventsChecker;
        events_checker.zeValidation = zeChecker;
        events_checker.zesValidation = zesChecker;
        events_checker.zetValidation = zetChecker;

        validation_layer::context.validationHandlers.push_back(&events_checker);
    }
}